

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.cc
# Opt level: O0

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 FileFactory::ReadFile(string *filename)

{
  FileFactory *pFVar1;
  ifstream *__p;
  undefined8 in_RSI;
  tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  in_RDI;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> this;
  
  this._M_head_impl =
       (basic_istream<char,_std::char_traits<char>_> *)
       in_RDI.
       super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl;
  pFVar1 = capture_thread::ThreadCapture<FileFactory>::GetCurrent();
  if (pFVar1 == (FileFactory *)0x0) {
    __p = (ifstream *)operator_new(0x208);
    std::ifstream::ifstream(__p,in_RSI,8);
    std::unique_ptr<std::istream,std::default_delete<std::istream>>::
    unique_ptr<std::default_delete<std::istream>,void>
              ((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                *)this._M_head_impl,(pointer)__p);
  }
  else {
    pFVar1 = capture_thread::ThreadCapture<FileFactory>::GetCurrent();
    (*(pFVar1->super_ThreadCapture<FileFactory>)._vptr_ThreadCapture[2])
              (this._M_head_impl,pFVar1,in_RSI);
  }
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl;
}

Assistant:

static std::unique_ptr<std::istream> ReadFile(const std::string& filename) {
    if (GetCurrent()) {
      return GetCurrent()->GetReadStream(filename);
    } else {
      return std::unique_ptr<std::istream>(new std::ifstream(filename));
    }
  }